

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::Matches
          (TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<unsigned_short&>>,std::tuple<unsigned_short&>>
                    (&this->matchers_,args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<unsigned_short_&>_&>::Matches
                      (&(this->extra_matcher_).
                        super_MatcherBase<const_std::tuple<unsigned_short_&>_&>,args);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }